

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void opj_mqc_bypass_init_enc(opj_mqc_t *mqc)

{
  if (mqc->bp < mqc->start) {
    __assert_fail("mqc->bp >= mqc->start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                  ,0x153,"void opj_mqc_bypass_init_enc(opj_mqc_t *)");
  }
  mqc->c = 0;
  mqc->ct = 0xdeadbeef;
  if (mqc->bp[-1] != 0xff) {
    return;
  }
  __assert_fail("mqc->bp[-1] != 0xff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                ,0x15d,"void opj_mqc_bypass_init_enc(opj_mqc_t *)");
}

Assistant:

void opj_mqc_bypass_init_enc(opj_mqc_t *mqc)
{
    /* This function is normally called after at least one opj_mqc_flush() */
    /* which will have advance mqc->bp by at least 2 bytes beyond its */
    /* initial position */
    assert(mqc->bp >= mqc->start);
    mqc->c = 0;
    /* in theory we should initialize to 8, but use this special value */
    /* as a hint that opj_mqc_bypass_enc() has never been called, so */
    /* as to avoid the 0xff 0x7f elimination trick in opj_mqc_bypass_flush_enc() */
    /* to trigger when we don't have output any bit during this bypass sequence */
    /* Any value > 8 will do */
    mqc->ct = BYPASS_CT_INIT;
    /* Given that we are called after opj_mqc_flush(), the previous byte */
    /* cannot be 0xff. */
    assert(mqc->bp[-1] != 0xff);
}